

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_xor.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  Dataset *__x;
  long *plVar1;
  MakeNet *pMVar2;
  long lVar3;
  ulong uVar4;
  initializer_list<notch::core::LabeledData> samples;
  initializer_list<unsigned_long> __l;
  Net xorNet;
  LabeledDataset dataset;
  undefined1 local_288 [16];
  vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_> local_278;
  pointer pLStack_260;
  pointer local_258;
  pointer *ppLStack_250;
  bool local_248;
  undefined1 local_238 [16];
  pointer local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  pointer local_208;
  pointer local_200;
  LayerType local_1f8 [2];
  undefined8 *local_1f0;
  LayerType local_1e8 [2];
  undefined4 *local_1e0;
  undefined1 local_1d8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c0;
  undefined1 local_1b8 [72];
  string local_170;
  string local_150;
  code *local_130;
  undefined8 local_128;
  code *local_120;
  code *local_118;
  LabeledDataset local_110;
  LabeledDataset local_c8;
  LabeledDataset local_78;
  
  local_238._0_8_ = (_func_int **)0x2;
  local_238._8_8_ = operator_new(8);
  ((pointer)local_238._8_8_)->nInputs = 0;
  local_1b8._16_8_ = (element_type *)0x1;
  local_288._0_8_ = (Array *)local_238;
  local_1b8._24_8_ = operator_new(4);
  local_288._8_8_ = local_1b8 + 0x10;
  *(undefined4 *)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._24_8_)->_vptr__Sp_counted_base = 0;
  local_1b8._0_8_ = (element_type *)0x2;
  local_1b8._8_8_ = operator_new(8);
  local_278.super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_1b8;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_)->_vptr__Sp_counted_base =
       (_func_int **)0x3f80000000000000;
  local_1d8._16_8_ = (element_type *)0x1;
  local_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(4);
  local_278.super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)(local_1d8 + 0x10);
  *(undefined4 *)&(local_1c0._M_pi)->_vptr__Sp_counted_base = 0x3f800000;
  local_1d8._0_8_ = 2;
  local_1d8._8_8_ = operator_new(8);
  local_278.super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1d8;
  *(undefined8 *)local_1d8._8_8_ = 0x3f800000;
  local_1e8[0] = Activation;
  local_1e8[1] = FC;
  local_1e0 = (undefined4 *)operator_new(4);
  pLStack_260 = local_1e8;
  *local_1e0 = 0x3f800000;
  local_1f8 = (LayerType  [2])0x2;
  local_1f0 = (undefined8 *)operator_new(8);
  local_258 = local_1f8;
  *local_1f0 = 0x3f8000003f800000;
  local_208 = (pointer)0x1;
  local_200 = (pointer)operator_new(4);
  ppLStack_250 = &local_208;
  *local_200 = FC;
  samples._M_len = 4;
  samples._M_array = (iterator)local_288;
  notch::core::LabeledDataset::LabeledDataset(&local_110,samples);
  operator_delete(local_200);
  operator_delete(local_1f0);
  operator_delete(local_1e0);
  operator_delete((void *)local_1d8._8_8_);
  operator_delete(local_1c0._M_pi);
  operator_delete((void *)local_1b8._8_8_);
  operator_delete((void *)local_1b8._24_8_);
  operator_delete((void *)local_238._8_8_);
  local_258 = (pointer)0x0;
  ppLStack_250 = (pointer *)0x0;
  local_278.super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLStack_260 = (pointer)0x0;
  local_278.super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288._0_8_ = (Array *)0x0;
  local_288._8_8_ = (Array *)0x0;
  local_248 = false;
  local_1b8._16_8_ = (element_type *)0x2;
  local_1b8._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  local_1b8._32_8_ = (element_type *)0x1;
  __l._M_len = 3;
  __l._M_array = (iterator)(local_1b8 + 0x10);
  notch::core::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_1b8 + 0x30),__l,
             (allocator_type *)local_1b8);
  pMVar2 = notch::core::MakeNet::MultilayerPerceptron
                     ((MakeNet *)local_288,
                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_1b8 + 0x30),
                      (Activation *)notch::core::scaledTanh);
  pMVar2 = notch::core::MakeNet::addLoss(pMVar2,L2Loss);
  local_128 = 0;
  local_130 = notch::core::Init::normalXavier;
  local_118 = notch::core::std::
              _Function_handler<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int),_void_(*)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
              ::_M_invoke;
  local_120 = notch::core::std::
              _Function_handler<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int),_void_(*)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
              ::_M_manager;
  notch::core::MakeNet::init((MakeNet *)local_238,(EVP_PKEY_CTX *)pMVar2);
  if (local_120 != (code *)0x0) {
    (*local_120)(&local_130,&local_130,3);
  }
  if ((Activation *)local_1b8._48_8_ != (Activation *)0x0) {
    operator_delete((void *)local_1b8._48_8_);
  }
  if (pLStack_260 != (pointer)0x0) {
    operator_delete(pLStack_260);
  }
  notch::core::std::vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>::~vector
            (&local_278);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"training set:\n",0xe);
  local_288._0_8_ = &std::cout;
  notch::io::CSVWriter::operator<<((CSVWriter *)local_288,&local_110);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"initial","");
  __x = &local_110.inputs;
  local_78.outputDimension = local_110.outputDimension;
  local_78.nSamples = local_110.nSamples;
  local_78.inputDimension = local_110.inputDimension;
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::vector
            (&local_78.inputs,__x);
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::vector
            (&local_78.outputs,&local_110.outputs);
  print_net(&local_150,(Net *)local_238,&local_78);
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            (&local_78.outputs);
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            (&local_78.inputs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_288._0_8_ = &PTR_update_00120ce0;
  local_288._8_8_ = (Array *)0x3f6666663c23d70a;
  local_278.super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_278.
                        super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  local_278.super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLStack_260 = (pointer)0x0;
  local_258 = (pointer)0x0;
  if (local_228 != (pointer)local_238._8_8_) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      plVar1 = *(long **)((long)(size_t *)local_238._8_8_ + lVar3);
      (**(code **)(*plVar1 + 0x70))(plVar1,local_288);
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < (ulong)((long)local_228 - local_238._8_8_ >> 4));
  }
  local_288._0_8_ = &PTR_update_00120ce0;
  operator_delete(local_258);
  operator_delete(local_278.
                  super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_288._0_4_ = 100;
  local_278.super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)notch::core::std::
                _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/examples/demo_xor.cpp:56:32)>
                ::_M_invoke;
  local_278.super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)notch::core::std::
                _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/examples/demo_xor.cpp:56:32)>
                ::_M_manager;
  local_288._8_8_ = (Net *)local_238;
  local_278.super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&local_110;
  notch::core::SGD::train
            ((Net *)local_238,&local_110,500,(EpochCallback *)local_288,
             (IterationCallback *)notch::core::noIterationCallback);
  if (local_278.super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)local_278.
              super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>.
              _M_impl.super__Vector_impl_data._M_finish)(local_288 + 8,local_288 + 8,3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"final","");
  local_c8.outputDimension = local_110.outputDimension;
  local_c8.nSamples = local_110.nSamples;
  local_c8.inputDimension = local_110.inputDimension;
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::vector
            (&local_c8.inputs,__x);
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::vector
            (&local_c8.outputs,&local_110.outputs);
  print_net(&local_170,(Net *)local_238,&local_c8);
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            (&local_c8.outputs);
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            (&local_c8.inputs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  local_238._0_8_ = &PTR_append_00120708;
  if (local_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    notch::core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210._M_pi);
  }
  notch::core::std::
  vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
  ::~vector((vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
             *)(local_238 + 8));
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            (&local_110.outputs);
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            (__x);
  return 0;
}

Assistant:

int main(int, char *[]) {
    LabeledDataset dataset {{{0,0},{0}},
                            {{0,1},{1}},
                            {{1,0},{1}},
                            {{1,1},{0}}};

    Net xorNet = MakeNet()
        .MultilayerPerceptron({2, 2, 1}, scaledTanh)
        .addL2Loss().init();

    cout << "training set:\n";
    CSVWriter(cout) << dataset;
    cout << "\n";
    print_net("initial", xorNet, dataset);

    xorNet.setLearningPolicy(FixedRate(0.01f /* rate */, 0.9f /* momentum */));
    SGD::train(xorNet, dataset,
               500 /* epochs */,
               EpochCallback { /* every */ 100 /* epochs */,
                /* callback */ [&](int i) {
                   float loss = meanLoss(xorNet, dataset);
                   cout << "epoch " << setw(3) << right << i
                        << " loss = " << setw(10) << left << loss
                        << endl;
                   return false; // don't terminate;
               }});
    cout << "\n";

    print_net("final", xorNet, dataset);
    return 0;
}